

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

EStatusCode __thiscall
PDFWriter::StartPDF(PDFWriter *this,string *inOutputFilePath,EPDFVersion inPDFVersion,
                   LogConfiguration *inLogConfiguration,PDFCreationSettings *inPDFCreationSettings)

{
  bool bVar1;
  EPDFVersion inPDFVersion_00;
  IByteWriterWithPosition *inOutputStream;
  EStatusCode status;
  EPDFVersion pdfVersion;
  PDFCreationSettings *inPDFCreationSettings_local;
  LogConfiguration *inLogConfiguration_local;
  EPDFVersion inPDFVersion_local;
  string *inOutputFilePath_local;
  PDFWriter *this_local;
  
  inPDFVersion_00 =
       thisOrDefaultVersion(inPDFVersion,(bool)(inPDFCreationSettings->WriteXrefAsXrefStream & 1));
  SetupLog(this,inLogConfiguration);
  SetupCreationSettings(this,inPDFCreationSettings);
  this_local._4_4_ = OutputFile::OpenFile(&this->mOutputFile,inOutputFilePath,false);
  if (this_local._4_4_ == eSuccess) {
    inOutputStream = OutputFile::GetOutputStream(&this->mOutputFile);
    ObjectsContext::SetOutputStream(&this->mObjectsContext,inOutputStream);
    PDFHummus::DocumentContext::SetOutputFileInformation(&this->mDocumentContext,&this->mOutputFile)
    ;
    if (((inPDFCreationSettings->DocumentEncryptionOptions).ShouldEncrypt & 1U) != 0) {
      PDFHummus::DocumentContext::SetupEncryption
                (&this->mDocumentContext,&inPDFCreationSettings->DocumentEncryptionOptions,
                 inPDFVersion_00);
      bVar1 = PDFHummus::DocumentContext::SupportsEncryption(&this->mDocumentContext);
      if (!bVar1) {
        OutputFile::CloseFile(&this->mOutputFile);
        return eFailure;
      }
    }
    this->mIsModified = false;
    this_local._4_4_ =
         PDFHummus::DocumentContext::WriteHeader(&this->mDocumentContext,inPDFVersion_00);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode PDFWriter::StartPDF(
							const std::string& inOutputFilePath,
							EPDFVersion inPDFVersion,
							const LogConfiguration& inLogConfiguration,
							const PDFCreationSettings& inPDFCreationSettings)
{
	EPDFVersion pdfVersion = thisOrDefaultVersion(inPDFVersion, inPDFCreationSettings.WriteXrefAsXrefStream);
	SetupLog(inLogConfiguration);
	SetupCreationSettings(inPDFCreationSettings);

	EStatusCode status = mOutputFile.OpenFile(inOutputFilePath);
	if(status != eSuccess)
		return status;

	mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
	mDocumentContext.SetOutputFileInformation(&mOutputFile);

	if (inPDFCreationSettings.DocumentEncryptionOptions.ShouldEncrypt) {
		mDocumentContext.SetupEncryption(inPDFCreationSettings.DocumentEncryptionOptions, pdfVersion);
		if (!mDocumentContext.SupportsEncryption()) {
			mOutputFile.CloseFile(); // close the file, to keep things clean
			return eFailure;
		}
	}

	mIsModified = false;

	return mDocumentContext.WriteHeader(pdfVersion);
}